

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O1

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_3;
  PathDeclarationSyntax *args_5;
  ConditionalPathDeclarationSyntax *pCVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_69;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  
  local_68 = deepClone<slang::syntax::AttributeInstanceSyntax>
                       ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                        (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x70),(DeepCloneVisitor *)&local_60,
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0x78),(BumpAllocator *)__child_stack);
  args_5 = (PathDeclarationSyntax *)
           detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x88),&local_69,(BumpAllocator *)__child_stack);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ConditionalPathDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PathDeclarationSyntax&>
                     ((BumpAllocator *)__child_stack,local_68,&local_40,&local_50,
                      (ExpressionSyntax *)args_3,&local_60,args_5);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ConditionalPathDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ConditionalPathDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.predicate, alloc),
        node.closeParen.deepClone(alloc),
        *deepClone<PathDeclarationSyntax>(*node.path, alloc)
    );
}